

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  ushort *puVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  string *in_RCX;
  anon_unknown_24 *this_00;
  string_view name;
  string_view element_name;
  string error;
  ServiceDescriptor *local_70;
  VoidPtr local_68;
  code *pcStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ServiceDescriptor **local_38;
  undefined1 **local_30;
  
  local_50 = 0;
  local_48 = 0;
  puVar1 = (ushort *)(service->all_names_).payload_;
  this_00 = (anon_unknown_24 *)(ulong)*puVar1;
  name._M_len = (long)puVar1 + ~(ulong)this_00;
  name._M_str = (char *)&local_58;
  local_70 = service;
  local_58 = &local_48;
  bVar2 = anon_unknown_24::IsValidTitleCaseName(this_00,name,in_RCX);
  if (!bVar2) {
    puVar1 = (ushort *)(service->all_names_).payload_;
    element_name._M_len = (ulong)*puVar1;
    element_name._M_str = (char *)((long)puVar1 + ~element_name._M_len);
    local_38 = &local_70;
    local_68.obj = &local_38;
    pcStack_60 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>(google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptorProto_const&)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>(google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptorProto_const&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_68.obj;
    local_30 = &local_58;
    AddError(this,element_name,&proto->super_Message,NAME,make_error);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(
    const ServiceDescriptor* service, const ServiceDescriptorProto& proto) {
  std::string error;
  if (!IsValidTitleCaseName(service->name(), &error)) {
    AddError(service->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Service name ", service->name(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}